

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.cpp
# Opt level: O0

void __thiscall
Diligent::SPIRVShaderResourceAttribs::SPIRVShaderResourceAttribs
          (SPIRVShaderResourceAttribs *this,Compiler *Compiler,Resource *Res,char *_Name,
          ResourceType _Type,Uint32 _BufferStaticSize,Uint32 _BufferStride)

{
  RESOURCE_DIMENSION RVar1;
  bool bVar2;
  unsigned_short uVar3;
  uint32_t uVar4;
  Uint32 _BufferStaticSize_local;
  ResourceType _Type_local;
  char *_Name_local;
  Resource *Res_local;
  Compiler *Compiler_local;
  SPIRVShaderResourceAttribs *this_local;
  
  this->Name = _Name;
  uVar3 = GetResourceArraySize<unsigned_short_const>(Compiler,Res);
  this->ArraySize = uVar3;
  this->Type = _Type;
  RVar1 = Diligent::GetResourceDimension(Compiler,Res);
  this->field_0xb = this->field_0xb & 0x80 | RVar1 & 0x7f;
  bVar2 = Diligent::IsMultisample(Compiler,Res);
  this->field_0xb = this->field_0xb & 0x7f | bVar2 << 7;
  uVar4 = GetDecorationOffset(Compiler,Res,Binding);
  this->BindingDecorationOffset = uVar4;
  uVar4 = GetDecorationOffset(Compiler,Res,DecorationDescriptorSet);
  this->DescriptorSetDecorationOffset = uVar4;
  this->BufferStaticSize = _BufferStaticSize;
  this->BufferStride = _BufferStride;
  return;
}

Assistant:

SPIRVShaderResourceAttribs::SPIRVShaderResourceAttribs(const diligent_spirv_cross::Compiler& Compiler,
                                                       const diligent_spirv_cross::Resource& Res,
                                                       const char*                           _Name,
                                                       ResourceType                          _Type,
                                                       Uint32                                _BufferStaticSize,
                                                       Uint32                                _BufferStride) noexcept :
    // clang-format off
    Name                          {_Name},
    ArraySize                     {GetResourceArraySize<decltype(ArraySize)>(Compiler, Res)},
    Type                          {_Type},
    ResourceDim                   {Diligent::GetResourceDimension(Compiler, Res)},
    IsMS                          {Diligent::IsMultisample(Compiler, Res) ? Uint8{1} : Uint8{0}},
    BindingDecorationOffset       {GetDecorationOffset(Compiler, Res, spv::Decoration::DecorationBinding)},
    DescriptorSetDecorationOffset {GetDecorationOffset(Compiler, Res, spv::Decoration::DecorationDescriptorSet)},
    BufferStaticSize              {_BufferStaticSize},
    BufferStride                  {_BufferStride}
// clang-format on
{}